

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O0

Error llvm::DWARFDebugLoclists::visitLocationList
                (DWARFDataExtractor *Data,uint64_t *Offset,uint16_t Version,
                function_ref<bool_(const_llvm::DWARFDebugLoclists::Entry_&)> F)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  undefined6 in_register_00000012;
  error_code EC;
  bool local_14d;
  uint32_t local_148;
  Error local_c8;
  uint32_t local_bc;
  int local_b8;
  uint Bytes;
  error_code local_b0;
  Cursor local_a0;
  undefined1 local_88 [8];
  Entry E;
  undefined1 local_48 [7];
  bool Continue;
  Cursor C;
  uint16_t Version_local;
  uint64_t *Offset_local;
  DWARFDataExtractor *Data_local;
  function_ref<bool_(const_llvm::DWARFDebugLoclists::Entry_&)> F_local;
  
  Data_local = (DWARFDataExtractor *)F.callable;
  C.Err.Payload._6_2_ = (ushort)F.callback;
  F_local.callable = (intptr_t)Data;
  DataExtractor::Cursor::Cursor
            ((Cursor *)local_48,*(uint64_t *)CONCAT62(in_register_00000012,Version));
  E.Loc._23_1_ = 1;
  do {
    if ((E.Loc._23_1_ & 1) == 0) {
      uVar4 = DataExtractor::Cursor::tell((Cursor *)local_48);
      *(uint64_t *)CONCAT62(in_register_00000012,Version) = uVar4;
      Error::success();
      Error::Error((Error *)Data,&local_c8);
      ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_c8);
      local_b8 = 1;
      break;
    }
    Entry::Entry((Entry *)local_88);
    E._0_8_ = DataExtractor::Cursor::tell((Cursor *)local_48);
    local_88[0] = DataExtractor::getU8((DataExtractor *)Offset,(Cursor *)local_48);
    switch(local_88[0]) {
    case 0:
      break;
    case 1:
      E.Offset = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_48);
      break;
    case 2:
    case 5:
    case 7:
    default:
      DataExtractor::Cursor::takeError(&local_a0);
      cantFail((Error *)&local_a0,(char *)0x0);
      Error::~Error((Error *)&local_a0);
      std::error_code::error_code<llvm::errc,void>(&local_b0,illegal_byte_sequence);
      Bytes = (uint)local_88[0];
      EC._M_cat._0_4_ = local_b0._M_value;
      EC._0_8_ = Data;
      EC._M_cat._4_4_ = 0;
      createStringError<int>(EC,(char *)local_b0._M_cat,(int *)"LLE of kind %x not supported");
      local_b8 = 1;
      goto LAB_02024922;
    case 3:
      E.Offset = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_48);
      if (C.Err.Payload._6_2_ < 5) {
        uVar3 = DataExtractor::getU32((DataExtractor *)Offset,(Cursor *)local_48);
        E.Value0 = (uint64_t)uVar3;
      }
      else {
        E.Value0 = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_48);
      }
      break;
    case 4:
      E.Offset = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_48);
      E.Value0 = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_48);
      break;
    case 6:
      E.Offset = DWARFDataExtractor::getRelocatedAddress
                           ((DWARFDataExtractor *)Offset,(Cursor *)local_48,(uint64_t *)0x0);
      break;
    case 8:
      E.Offset = DWARFDataExtractor::getRelocatedAddress
                           ((DWARFDataExtractor *)Offset,(Cursor *)local_48,(uint64_t *)0x0);
      E.Value0 = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_48);
    }
    if (((local_88[0] != 6) && (local_88[0] != 1)) && (local_88[0] != 0)) {
      if (C.Err.Payload._6_2_ < 5) {
        uVar2 = DataExtractor::getU16((DataExtractor *)Offset,(Cursor *)local_48);
        local_148 = (uint32_t)uVar2;
      }
      else {
        uVar4 = DataExtractor::getULEB128((DataExtractor *)Offset,(Cursor *)local_48);
        local_148 = (uint32_t)uVar4;
      }
      local_bc = local_148;
      DataExtractor::getU8
                ((DataExtractor *)Offset,(Cursor *)local_48,
                 (SmallVectorImpl<unsigned_char> *)&E.Value1,local_148);
    }
    bVar1 = DataExtractor::Cursor::operator_cast_to_bool((Cursor *)local_48);
    if (bVar1) {
      local_14d = function_ref<bool_(const_llvm::DWARFDebugLoclists::Entry_&)>::operator()
                            ((function_ref<bool_(const_llvm::DWARFDebugLoclists::Entry_&)> *)
                             &Data_local,(Entry *)local_88);
      local_14d = local_14d && local_88[0] != 0;
      E.Loc._23_1_ = local_14d;
      local_b8 = 0;
    }
    else {
      DataExtractor::Cursor::takeError((Cursor *)Data);
      local_b8 = 1;
    }
LAB_02024922:
    Entry::~Entry((Entry *)local_88);
  } while (local_b8 == 0);
  DataExtractor::Cursor::~Cursor((Cursor *)local_48);
  return (Error)(ErrorInfoBase *)Data;
}

Assistant:

Error DWARFDebugLoclists::visitLocationList(
    const DWARFDataExtractor &Data, uint64_t *Offset, uint16_t Version,
    llvm::function_ref<bool(const Entry &)> F) {

  DataExtractor::Cursor C(*Offset);
  bool Continue = true;
  while (Continue) {
    Entry E;
    E.Offset = C.tell();
    E.Kind = Data.getU8(C);
    switch (E.Kind) {
    case dwarf::DW_LLE_end_of_list:
      break;
    case dwarf::DW_LLE_base_addressx:
      E.Value0 = Data.getULEB128(C);
      break;
    case dwarf::DW_LLE_startx_length:
      E.Value0 = Data.getULEB128(C);
      // Pre-DWARF 5 has different interpretation of the length field. We have
      // to support both pre- and standartized styles for the compatibility.
      if (Version < 5)
        E.Value1 = Data.getU32(C);
      else
        E.Value1 = Data.getULEB128(C);
      break;
    case dwarf::DW_LLE_offset_pair:
      E.Value0 = Data.getULEB128(C);
      E.Value1 = Data.getULEB128(C);
      break;
    case dwarf::DW_LLE_base_address:
      E.Value0 = Data.getRelocatedAddress(C);
      break;
    case dwarf::DW_LLE_start_length:
      E.Value0 = Data.getRelocatedAddress(C);
      E.Value1 = Data.getULEB128(C);
      break;
    case dwarf::DW_LLE_startx_endx:
    case dwarf::DW_LLE_default_location:
    case dwarf::DW_LLE_start_end:
    default:
      cantFail(C.takeError());
      return createStringError(errc::illegal_byte_sequence,
                               "LLE of kind %x not supported", (int)E.Kind);
    }

    if (E.Kind != dwarf::DW_LLE_base_address &&
        E.Kind != dwarf::DW_LLE_base_addressx &&
        E.Kind != dwarf::DW_LLE_end_of_list) {
      unsigned Bytes = Version >= 5 ? Data.getULEB128(C) : Data.getU16(C);
      // A single location description describing the location of the object...
      Data.getU8(C, E.Loc, Bytes);
    }

    if (!C)
      return C.takeError();
    Continue = F(E) && E.Kind != dwarf::DW_LLE_end_of_list;
  }
  *Offset = C.tell();
  return Error::success();
}